

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

void wallet::UpdateWalletSetting
               (Chain *chain,string *wallet_name,optional<bool> load_on_startup,
               vector<bilingual_str,_std::allocator<bilingual_str>_> *warnings)

{
  bool bVar1;
  long *plVar2;
  long in_FS_OFFSET;
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  long *local_90;
  long local_88;
  long local_80 [2];
  undefined1 local_70 [32];
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (((ushort)load_on_startup.super__Optional_base<bool,_true,_true>._M_payload.
               super__Optional_payload_base<bool> >> 8 & 1) == 0) goto LAB_001522cd;
  if (((ushort)load_on_startup.super__Optional_base<bool,_true,_true>._M_payload.
               super__Optional_payload_base<bool> & 1) == 0) {
LAB_00152151:
    bVar1 = RemoveWalletSetting(chain,wallet_name);
    if (bVar1) goto LAB_001522cd;
    local_b0 = local_a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,
               "Wallet load on startup setting could not be updated, so wallet may still be loaded next node startup."
               ,"");
    local_70._0_8_ = local_70 + 0x10;
    std::__cxx11::string::_M_construct<char*>((string *)local_70,local_b0,local_a8 + (long)local_b0)
    ;
    local_50._M_p = (pointer)&local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,local_b0,local_a8 + (long)local_b0);
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
              (warnings,(bilingual_str *)local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p != &local_40) {
      operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
      operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
    }
    local_80[0] = local_a0[0];
    plVar2 = local_b0;
    if (local_b0 == local_a0) goto LAB_001522cd;
  }
  else {
    bVar1 = AddWalletSetting(chain,wallet_name);
    if (bVar1) {
      if (((ushort)load_on_startup.super__Optional_base<bool,_true,_true>._M_payload.
                   super__Optional_payload_base<bool> & 1) != 0) goto LAB_001522cd;
      goto LAB_00152151;
    }
    local_90 = local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,
               "Wallet load on startup setting could not be updated, so wallet may not be loaded next node startup."
               ,"");
    local_70._0_8_ = local_70 + 0x10;
    std::__cxx11::string::_M_construct<char*>((string *)local_70,local_90,local_88 + (long)local_90)
    ;
    local_50._M_p = (pointer)&local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,local_90,local_88 + (long)local_90);
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
              (warnings,(bilingual_str *)local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p != &local_40) {
      operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
      operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
    }
    plVar2 = local_90;
    if (local_90 == local_80) goto LAB_001522cd;
  }
  operator_delete(plVar2,local_80[0] + 1);
LAB_001522cd:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void UpdateWalletSetting(interfaces::Chain& chain,
                                const std::string& wallet_name,
                                std::optional<bool> load_on_startup,
                                std::vector<bilingual_str>& warnings)
{
    if (!load_on_startup) return;
    if (load_on_startup.value() && !AddWalletSetting(chain, wallet_name)) {
        warnings.emplace_back(Untranslated("Wallet load on startup setting could not be updated, so wallet may not be loaded next node startup."));
    } else if (!load_on_startup.value() && !RemoveWalletSetting(chain, wallet_name)) {
        warnings.emplace_back(Untranslated("Wallet load on startup setting could not be updated, so wallet may still be loaded next node startup."));
    }
}